

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn2612.c
# Opt level: O0

void FM_KEYOFF_CSM(FM_CH *CH,int s)

{
  FM_SLOT *SLOT;
  int s_local;
  FM_CH *CH_local;
  
  if (((CH->SLOT[s].key == '\0') && (1 < CH->SLOT[s].state)) &&
     (CH->SLOT[s].state = '\x01', (CH->SLOT[s].ssg & 8) != 0)) {
    if (CH->SLOT[s].ssgn != (CH->SLOT[s].ssg & 4)) {
      CH->SLOT[s].volume = 0x200 - CH->SLOT[s].volume;
    }
    if (0x1ff < CH->SLOT[s].volume) {
      CH->SLOT[s].volume = 0x3ff;
      CH->SLOT[s].state = '\0';
    }
    CH->SLOT[s].vol_out = CH->SLOT[s].volume + CH->SLOT[s].tl;
  }
  return;
}

Assistant:

INLINE void FM_KEYOFF_CSM(FM_CH *CH , int s )
{
	FM_SLOT *SLOT = &CH->SLOT[s];
	if (!SLOT->key)
	{
		if (SLOT->state>EG_REL)
		{
			SLOT->state = EG_REL; /* phase -> Release */

			/* SSG-EG specific update */
			if (SLOT->ssg&0x08)
			{
				/* convert EG attenuation level */
				if (SLOT->ssgn ^ (SLOT->ssg&0x04))
					SLOT->volume = (0x200 - SLOT->volume);

				/* force EG attenuation level */
				if (SLOT->volume >= 0x200)
				{
					SLOT->volume = MAX_ATT_INDEX;
					SLOT->state  = EG_OFF;
				}

				/* recalculate EG output */
				SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
			}
		}
	}
}